

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void genScript(string *material_name,string *image_name,string *scripts_dir)

{
  ostream *poVar1;
  string local_580 [32];
  string local_560 [32];
  ostream local_540 [8];
  ofstream ofs;
  stringstream local_330 [8];
  stringstream file_path;
  ostream local_320 [376];
  stringstream local_1a8 [8];
  stringstream script_str;
  ostream local_198 [376];
  string *local_20;
  string *scripts_dir_local;
  string *image_name_local;
  string *material_name_local;
  
  local_20 = scripts_dir;
  scripts_dir_local = image_name;
  image_name_local = material_name;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  poVar1 = std::operator<<(local_198,"material ");
  poVar1 = std::operator<<(poVar1,"Plugin/");
  poVar1 = std::operator<<(poVar1,(string *)material_name);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"{");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  technique");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"    pass");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"    {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"      texture_unit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"      {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"        texture ");
  poVar1 = std::operator<<(poVar1,"Plugin/");
  poVar1 = std::operator<<(poVar1,(string *)image_name);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"        filtering anistropic");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"        max_anisotropy 16");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"      }");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"    }");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  }");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_320,(string *)local_20);
  poVar1 = std::operator<<(poVar1,(string *)material_name);
  std::operator<<(poVar1,".material");
  std::__cxx11::stringstream::str();
  std::ofstream::ofstream(local_540,local_560,0x10);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::stringstream::str();
  std::operator<<(local_540,local_580);
  std::__cxx11::string::~string(local_580);
  std::ofstream::close();
  std::ofstream::~ofstream(local_540);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void genScript(
    const std::string material_name,
    const std::string image_name,
    const std::string & scripts_dir){

    std::stringstream script_str;
    std::stringstream file_path;

    if (GENERATE_SCRIPT){

        script_str
        << "material " << MATERIAL_PREFIX << material_name
        << std::endl << "{"
        << std::endl << "  technique"
        << std::endl << "  {"
        << std::endl << "    pass"
        << std::endl << "    {"
        << std::endl << "      texture_unit"
        << std::endl << "      {"
        << std::endl << "        texture " << TEXTURE_PREFIX << image_name
        << std::endl << "        filtering anistropic"
        << std::endl << "        max_anisotropy 16"
        << std::endl << "      }"
        << std::endl << "    }"
        << std::endl << "  }"
        << std::endl << "}" << std::endl;

        file_path << scripts_dir << material_name << MATERIAL_EXT;

        /* Write to file */
        std::ofstream ofs(file_path.str());
        ofs << script_str.str();
        ofs.close();
    }
}